

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taia_pack.c
# Opt level: O0

void taia_pack(char *s,taia *t)

{
  unsigned_long uVar1;
  unsigned_long x;
  taia *t_local;
  char *s_local;
  
  tai_pack(s,&t->sec);
  uVar1 = t->atto;
  s[0xf] = (char)uVar1;
  s[0xe] = (char)(uVar1 >> 8);
  s[0xd] = (char)(uVar1 >> 0x10);
  s[0xc] = (char)(uVar1 >> 0x18);
  uVar1 = t->nano;
  s[0xb] = (char)uVar1;
  s[10] = (char)(uVar1 >> 8);
  s[9] = (char)(uVar1 >> 0x10);
  s[8] = (char)(uVar1 >> 0x18);
  return;
}

Assistant:

void taia_pack(char *s,const struct taia *t)
{
  unsigned long x;

  tai_pack(s,&t->sec);
  s += 8;

  x = t->atto;
  s[7] = x & 255; x >>= 8;
  s[6] = x & 255; x >>= 8;
  s[5] = x & 255; x >>= 8;
  s[4] = x;
  x = t->nano;
  s[3] = x & 255; x >>= 8;
  s[2] = x & 255; x >>= 8;
  s[1] = x & 255; x >>= 8;
  s[0] = x;
}